

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O2

int decode_existing_symbol(byte_t *input_buffer)

{
  long lVar1;
  long lVar2;
  int iVar3;
  adh_node_t *node;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  byte_t sub_buffer [32];
  bit_array_t bit_array;
  
  lVar1 = in_bit_idx;
  lVar7 = 0;
  memset(&bit_array,0,0x102);
  sub_buffer[0x10] = '\0';
  sub_buffer[0x11] = '\0';
  sub_buffer[0x12] = '\0';
  sub_buffer[0x13] = '\0';
  sub_buffer[0x14] = '\0';
  sub_buffer[0x15] = '\0';
  sub_buffer[0x16] = '\0';
  sub_buffer[0x17] = '\0';
  sub_buffer[0x18] = '\0';
  sub_buffer[0x19] = '\0';
  sub_buffer[0x1a] = '\0';
  sub_buffer[0x1b] = '\0';
  sub_buffer[0x1c] = '\0';
  sub_buffer[0x1d] = '\0';
  sub_buffer[0x1e] = '\0';
  sub_buffer[0x1f] = '\0';
  sub_buffer[0] = '\0';
  sub_buffer[1] = '\0';
  sub_buffer[2] = '\0';
  sub_buffer[3] = '\0';
  sub_buffer[4] = '\0';
  sub_buffer[5] = '\0';
  sub_buffer[6] = '\0';
  sub_buffer[7] = '\0';
  sub_buffer[8] = '\0';
  sub_buffer[9] = '\0';
  sub_buffer[10] = '\0';
  sub_buffer[0xb] = '\0';
  sub_buffer[0xc] = '\0';
  sub_buffer[0xd] = '\0';
  sub_buffer[0xe] = '\0';
  sub_buffer[0xf] = '\0';
  lVar6 = last_bit_idx - lVar1;
  if (0xfe < lVar6) {
    lVar6 = 0xff;
  }
  iVar3 = read_data_cross_bytes(input_buffer,(int)lVar6 + 1,sub_buffer);
  node = (adh_node_t *)0x0;
  while ((lVar2 = in_bit_idx, lVar6 = last_bit_idx, lVar7 < iVar3 && (node == (adh_node_t *)0x0))) {
    node = (adh_node_t *)0x0;
    uVar8 = 0;
    while ((uVar8 < 8 && (node == (adh_node_t *)0x0))) {
      uVar5 = (ulong)bit_array.length;
      if (0x100 < uVar5) {
        log_error("decode_existing_symbol","bit_array_size (%d) >= MAX_CODE_BITS (%d)",uVar5,0x100);
        goto LAB_00102193;
      }
      for (; 0 < (long)uVar5; uVar5 = uVar5 - 1) {
        bit_array.buffer[uVar5] = bit_array.buffer[uVar5 - 1];
      }
      bit_array.buffer[0] = bit_check(sub_buffer[lVar7],7 - uVar8);
      bit_array.length = bit_array.length + 1;
      node = adh_search_leaf_by_encoding(&bit_array);
      uVar8 = uVar8 + 1;
    }
    lVar7 = lVar7 + 1;
  }
  if (node == (adh_node_t *)0x0) {
    pcVar4 = fmt_bit_array(&bit_array);
    log_error("decode_existing_symbol","cannot find node: in_bit_idx=%u last_bit_idx=%u bin=%s\n",
              lVar2,lVar6,pcVar4);
LAB_00102193:
    iVar3 = 1;
  }
  else {
    in_bit_idx = lVar1 + (ulong)bit_array.length;
    output_buffer[output_byte_idx] = (byte_t)node->symbol;
    output_byte_idx = output_byte_idx + 1;
    iVar3 = 0;
    adh_update_tree(node,false);
  }
  return iVar3;
}

Assistant:

int decode_existing_symbol(const byte_t input_buffer[]) {
    long original_input_buffer_bit_idx = in_bit_idx;

    adh_node_t* node = NULL;
    bit_array_t bit_array = {0};
    byte_t  sub_buffer[MAX_CODE_BYTES] = {0};
    long missing = last_bit_idx - in_bit_idx + 1;

#ifdef _DEBUG
    log_debug("decode_existing_symbol", "in_bit_idx=%-8u last_bit_idx=%u missing=%d\n",
              in_bit_idx, last_bit_idx, missing);
#endif

    int max_bits = MAX_CODE_BITS < missing ? MAX_CODE_BITS : missing;
    int num_bytes = read_data_cross_bytes(input_buffer, max_bits, sub_buffer);

    for (int byte_idx = 0; byte_idx < num_bytes && node == NULL; ++byte_idx) {
        for (int bit_idx = 0; bit_idx < SYMBOL_BITS && node == NULL; ++bit_idx) {
            if(bit_array.length > MAX_CODE_BITS) {
                log_error("decode_existing_symbol", "bit_array_size (%d) >= MAX_CODE_BITS (%d)", bit_array.length, MAX_CODE_BITS);
                return RC_FAIL;
            }

            // shift left previous bits
            for (int i = bit_array.length; i > 0; --i) {
                bit_array.buffer[i] = bit_array.buffer[i-1];
            }

            bit_array.buffer[0] = bit_check(sub_buffer[byte_idx], SYMBOL_BITS - bit_idx -1);
            bit_array.length++;
            node = adh_search_leaf_by_encoding(&bit_array);
        }
    }

    if(node == NULL) {
        log_error("decode_existing_symbol", "cannot find node: in_bit_idx=%u last_bit_idx=%u bin=%s\n",
                in_bit_idx, last_bit_idx, fmt_bit_array(&bit_array) );
        return RC_FAIL;
    }

#ifdef _DEBUG
    log_debug("decode_existing_symbol", "%s bin=%s\n", fmt_symbol(node->symbol), fmt_bit_array(&bit_array));
#endif

    in_bit_idx = original_input_buffer_bit_idx + bit_array.length;
    output_symbol((byte_t)node->symbol);
    adh_update_tree(node, false);
    return RC_OK;
}